

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Maybe<kj::Own<const_kj::ReadableDirectory>_> __thiscall
kj::anon_unknown_35::InMemoryDirectory::asDirectory
          (InMemoryDirectory *this,
          Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *lock,EntryImpl *entry)

{
  long in_RCX;
  ReadableDirectory *extraout_RDX;
  ReadableDirectory *extraout_RDX_00;
  ReadableDirectory *extraout_RDX_01;
  ReadableDirectory *pRVar1;
  void *in_R8;
  PathPtr path;
  Maybe<kj::Own<const_kj::ReadableDirectory>_> MVar2;
  Path newPath;
  Array<kj::String> local_38;
  
  if (*(int *)(in_RCX + 0x18) == 3) {
    SymlinkNode::parse((Path *)&local_38,(SymlinkNode *)(in_RCX + 0x20));
    Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::release
              ((Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)entry);
    path.parts.size_ = (size_t)local_38.ptr;
    path.parts.ptr = (String *)lock;
    tryOpenSubdir(this,path);
    Array<kj::String>::~Array(&local_38);
    pRVar1 = extraout_RDX_00;
  }
  else if (*(int *)(in_RCX + 0x18) == 2) {
    Directory::clone((Directory *)&local_38,*(__fn **)(in_RCX + 0x28),entry,(int)in_RCX,in_R8);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
         (_func_int **)local_38.ptr;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)local_38.size_;
    local_38.size_ = 0;
    Own<const_kj::Directory>::dispose((Own<const_kj::Directory> *)&local_38);
    pRVar1 = extraout_RDX;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              ((Fault *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x64b,FAILED,(char *)0x0,"\"not a directory\"",(char (*) [16])0x28accb);
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)&local_38);
    pRVar1 = extraout_RDX_01;
  }
  MVar2.ptr.ptr = pRVar1;
  MVar2.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory>_>)MVar2.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> asDirectory(
      kj::Locked<const Impl>& lock, const EntryImpl& entry) const {
    if (entry.node.is<DirectoryNode>()) {
      return entry.node.get<DirectoryNode>().directory->clone();
    } else if (entry.node.is<SymlinkNode>()) {
      auto newPath = entry.node.get<SymlinkNode>().parse();
      lock.release();
      return tryOpenSubdir(newPath);
    } else {
      KJ_FAIL_REQUIRE("not a directory") { return nullptr; }
    }
  }